

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall
embree::SceneGraph::HairSetNode::HairSetNode
          (HairSetNode *this,Ref<embree::SceneGraph::HairSetNode> *imesh,Transformations *spaces)

{
  MaterialNode *pMVar1;
  
  (this->super_Node).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Node).fileName._M_dataplus._M_p = (pointer)&(this->super_Node).fileName.field_2;
  (this->super_Node).fileName._M_string_length = 0;
  (this->super_Node).fileName.field_2._M_local_buf[0] = '\0';
  (this->super_Node).name._M_dataplus._M_p = (pointer)&(this->super_Node).name.field_2;
  (this->super_Node).name._M_string_length = 0;
  (this->super_Node).name.field_2._M_local_buf[0] = '\0';
  (this->super_Node).indegree = 0;
  (this->super_Node).closed = true;
  (this->super_Node).hasLightOrCamera = false;
  (this->super_Node).id = 0xffffffff;
  (this->super_Node).geometry = (void *)0x0;
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__HairSetNode_002c2b08;
  this->time_range = imesh->ptr->time_range;
  this->type = imesh->ptr->type;
  transformMSMBlurBuffer<embree::Vec3fx>(&this->positions,&imesh->ptr->positions,spaces);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(&this->normals,&imesh->ptr->normals,spaces);
  transformMSMBlurVectorBuffer<embree::Vec3fx>(&this->tangents,&imesh->ptr->tangents,spaces);
  transformMSMBlurVectorVec3faBuffer<embree::Vec3fa>(&this->dnormals,&imesh->ptr->dnormals,spaces);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::vector(&this->hairs,&imesh->ptr->hairs);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->flags,&imesh->ptr->flags);
  pMVar1 = (imesh->ptr->material).ptr;
  (this->material).ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  this->tessellation_rate = imesh->ptr->tessellation_rate;
  return;
}

Assistant:

HairSetNode (Ref<SceneGraph::HairSetNode> imesh, const Transformations& spaces)
        : Node(true),
        time_range(imesh->time_range),
        type(imesh->type),
        positions(transformMSMBlurBuffer(imesh->positions,spaces)),
        normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
        tangents(transformMSMBlurVectorBuffer(imesh->tangents,spaces)),
        dnormals(transformMSMBlurVectorVec3faBuffer(imesh->dnormals,spaces)),
        hairs(imesh->hairs), flags(imesh->flags), material(imesh->material), tessellation_rate(imesh->tessellation_rate) {}